

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_c4ab13::HandleHashCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view algo;
  string_view input;
  string_view value;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string out;
  string local_58;
  undefined1 local_38 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    algo._M_str = (char *)pbVar1->_M_string_length;
    algo._M_len = (size_t)&local_58;
    cmCryptoHash::New(algo);
    bVar2 = (cmCryptoHash *)local_58._M_dataplus._M_p != (cmCryptoHash *)0x0;
    if (bVar2) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      input._M_str = pbVar1[2]._M_dataplus._M_p;
      input._M_len = pbVar1[2]._M_string_length;
      cmCryptoHash::HashString_abi_cxx11_
                ((string *)local_38,(cmCryptoHash *)local_58._M_dataplus._M_p,input);
      value._M_str = (char *)local_38._0_8_;
      value._M_len = local_38._8_8_;
      cmMakefile::AddDefinition
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,value);
      if ((undefined1 *)local_38._0_8_ != local_38 + 0x10) {
        operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
      }
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
              ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_58);
  }
  else {
    local_38._8_8_ = (pbVar1->_M_dataplus)._M_p;
    local_38._0_8_ = pbVar1->_M_string_length;
    local_38._16_8_ = 0x30;
    local_38._24_8_ = " requires an output variable and an input string";
    views._M_len = 2;
    views._M_array = (iterator)local_38;
    cmCatViews_abi_cxx11_(&local_58,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HandleHashCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires an output variable and an input string"));
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0]));
  if (hash) {
    std::string out = hash->HashString(args[2]);
    status.GetMakefile().AddDefinition(args[1], out);
    return true;
  }
  return false;
}